

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O2

int fy_document_tag_directive_remove(fy_document *fyd,char *handle)

{
  list_head *plVar1;
  list_head *plVar2;
  fy_token *fyt;
  int iVar3;
  
  iVar3 = -1;
  if (((fyd != (fy_document *)0x0) && (handle != (char *)0x0)) &&
     (fyd->fyds != (fy_document_state *)0x0)) {
    fyt = fy_document_tag_directive_lookup(fyd,handle);
    if ((fyt != (fy_token *)0x0) && (fyt->refs == 1)) {
      plVar1 = (fyt->node).next;
      plVar2 = (fyt->node).prev;
      plVar1->prev = plVar2;
      plVar2->next = plVar1;
      (fyt->node).next = &fyt->node;
      (fyt->node).prev = &fyt->node;
      fy_token_unref(fyt);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int fy_document_tag_directive_remove(struct fy_document *fyd, const char *handle) {
    struct fy_token *fyt;

    if (!fyd || !fyd->fyds || !handle)
        return -1;

    /* it must not exist */
    fyt = fy_document_tag_directive_lookup(fyd, handle);
    if (!fyt || fyt->refs != 1)
        return -1;

    fy_token_list_del(&fyd->fyds->fyt_td, fyt);
    fy_token_unref(fyt);

    return 0;
}